

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::ReadNLString<TestNLHandler>
          (mp *this,NLStringRef str,TestNLHandler *handler,CStringRef name,int flags)

{
  ReadError *this_00;
  TestNLHandler *handler_00;
  int flags_00;
  NLStringRef data;
  TextReader<fmt::Locale> reader;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> local_158;
  NLHeader header;
  
  handler_00 = (TestNLHandler *)str.size_;
  data.size_ = (size_t)str.data_;
  data.data_ = (char *)this;
  internal::TextReader<fmt::Locale>::TextReader(&reader,data,(CStringRef)handler);
  memset(&header,0,0x110);
  NLHeader::NLHeader(&header);
  internal::TextReader<fmt::Locale>::ReadHeader(&reader,&header);
  ((handler_00->log).super_BasicWriter<char>.buffer_)->size_ = 0;
  flags_00 = (int)name.data_;
  if (header.super_NLInfo.super_NLInfo_C.format == 0) {
    local_158.num_vars_and_exprs_ = 0;
    local_158.reader_ = &reader;
    local_158.header_ = &header;
    local_158.handler_ = handler_00;
    local_158.flags_ = flags_00;
    internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::Read(&local_158);
  }
  else if (header.super_NLInfo.super_NLInfo_C.format == 1) {
    if (header.super_NLInfo.super_NLInfo_C.arith_kind == 1) {
      internal::ReadBinary<mp::internal::IdentityConverter,TestNLHandler>
                (&reader,&header,handler_00,flags_00);
    }
    else {
      if (1 < header.super_NLInfo.super_NLInfo_C.arith_kind - 1U) {
        this_00 = (ReadError *)__cxa_allocate_exception(0x40);
        ReadError::ReadError<>(this_00,(CStringRef)handler,0,0,(CStringRef)0x21c068);
        __cxa_throw(this_00,&ReadError::typeinfo,ReadError::~ReadError);
      }
      internal::ReadBinary<mp::internal::EndiannessConverter,TestNLHandler>
                (&reader,&header,handler_00,flags_00);
    }
  }
  internal::TextReader<fmt::Locale>::~TextReader(&reader);
  return;
}

Assistant:

void ReadNLString(NLStringRef str, Handler &handler,
                  fmt::CStringRef name, int flags) {
  // If handler is a Problem-like object (Problem::Builder type is defined)
  // then use ProblemBuilder API to populate it.
  typedef internal::NLAdapter<
      Handler, internal::HasBuilder<Handler>::value> Adapter;
  typename Adapter::RefType adapter(handler);
  internal::TextReader<> reader(str, name);
  NLHeader header = NLHeader();
  reader.ReadHeader(header);
  adapter.OnHeader(header);
  switch (header.format) {
  case NLHeader::TEXT:
    internal::NLReader<internal::TextReader<>, typename Adapter::Type>(
          reader, header, adapter, flags).Read();
    break;
  case NLHeader::BINARY: {
      using internal::ReadBinary;
    arith::Kind arith_kind = arith::GetKind();
    if (arith_kind == header.arith_kind) {
      ReadBinary<internal::IdentityConverter>(reader, header, adapter, flags);
      break;
    }
    if (!IsIEEE(arith_kind)
        || !IsIEEE((arith::Kind)header.arith_kind))
      throw ReadError(name, 0, 0, "unsupported floating-point arithmetic");
    ReadBinary<internal::EndiannessConverter>(reader, header, adapter, flags);
    break;
  }
  }
}